

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O3

UBool changesWhenCasefolded(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  Normalizer2 *pNVar4;
  undefined8 src;
  undefined4 uVar5;
  bool bVar6;
  UErrorCode errorCode;
  UnicodeString nfd;
  UChar dest [62];
  UErrorCode local_dc;
  UnicodeString local_d8;
  UChar *local_98 [17];
  
  local_d8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_d8.fUnion.fStackFields.fLengthAndFlags = 2;
  local_dc = U_ZERO_ERROR;
  pNVar4 = icu_63::Normalizer2::getNFCInstance(&local_dc);
  if (local_dc < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = (*(pNVar4->super_UObject)._vptr_UObject[7])(pNVar4,c,&local_d8);
    if ((char)iVar1 == '\0') {
      if (-1 < c) goto LAB_002c4855;
    }
    else {
      uVar2 = (uint)local_d8.fUnion.fStackFields.fLengthAndFlags;
      uVar5 = local_d8.fUnion.fFields.fLength;
      if (-1 < local_d8.fUnion.fStackFields.fLengthAndFlags) {
        uVar5 = (int)uVar2 >> 5;
      }
      if (uVar5 == 1) {
        if ((uVar2 & 2) != 0) {
          local_d8.fUnion.fFields.fArray = local_d8.fUnion.fStackFields.fBuffer;
        }
        c = (UChar32)(ushort)*local_d8.fUnion.fFields.fArray;
LAB_002c4855:
        iVar3 = ucase_toFullFolding_63(c,local_98,0);
        bVar6 = -1 < iVar3;
        goto LAB_002c4868;
      }
      if ((int)uVar5 < 3) {
        c = icu_63::UnicodeString::char32At(&local_d8,0);
        if ((-1 < c) && (uVar5 == 2 - (uint)((uint)c < 0x10000))) goto LAB_002c4855;
        uVar2 = (uint)(ushort)local_d8.fUnion.fStackFields.fLengthAndFlags;
      }
      if ((uVar2 & 0x11) == 0) {
        src = local_d8.fUnion.fFields.fArray;
        if ((uVar2 & 2) != 0) {
          src = local_d8.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        src = (char16_t *)0x0;
      }
      uVar5 = local_d8.fUnion.fFields.fLength;
      if (-1 < (short)uVar2) {
        uVar5 = (int)(short)uVar2 >> 5;
      }
      iVar3 = u_strFoldCase_63((UChar *)local_98,0x3e,(UChar *)src,uVar5,0,&local_dc);
      if (local_dc < U_ILLEGAL_ARGUMENT_ERROR) {
        if ((local_d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
          if ((local_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            local_d8.fUnion.fFields.fArray = local_d8.fUnion.fStackFields.fBuffer;
          }
        }
        else {
          local_d8.fUnion.fFields.fArray = (char16_t *)0x0;
        }
        if (-1 < local_d8.fUnion.fStackFields.fLengthAndFlags) {
          local_d8.fUnion.fFields.fLength = (int)local_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar3 = u_strCompare_63(local_d8.fUnion.fFields.fArray,local_d8.fUnion.fFields.fLength,
                                (UChar *)local_98,iVar3,'\0');
        bVar6 = iVar3 != 0;
        goto LAB_002c4868;
      }
    }
  }
  bVar6 = false;
LAB_002c4868:
  icu_63::UnicodeString::~UnicodeString(&local_d8);
  return bVar6;
}

Assistant:

static UBool changesWhenCasefolded(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UnicodeString nfd;
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *nfcNorm2=Normalizer2::getNFCInstance(errorCode);
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    if(nfcNorm2->getDecomposition(c, nfd)) {
        /* c has a decomposition */
        if(nfd.length()==1) {
            c=nfd[0];  /* single BMP code point */
        } else if(nfd.length()<=U16_MAX_LENGTH &&
                  nfd.length()==U16_LENGTH(c=nfd.char32At(0))
        ) {
            /* single supplementary code point */
        } else {
            c=U_SENTINEL;
        }
    } else if(c<0) {
        return FALSE;  /* protect against bad input */
    }
    if(c>=0) {
        /* single code point */
        const UChar *resultString;
        return (UBool)(ucase_toFullFolding(c, &resultString, U_FOLD_CASE_DEFAULT)>=0);
    } else {
        /* guess some large but stack-friendly capacity */
        UChar dest[2*UCASE_MAX_STRING_LENGTH];
        int32_t destLength;
        destLength=u_strFoldCase(dest, UPRV_LENGTHOF(dest),
                                  nfd.getBuffer(), nfd.length(),
                                  U_FOLD_CASE_DEFAULT, &errorCode);
        return (UBool)(U_SUCCESS(errorCode) &&
                       0!=u_strCompare(nfd.getBuffer(), nfd.length(),
                                       dest, destLength, FALSE));
    }
}